

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

ITracker * __thiscall
Catch::TestCaseTracking::ITracker::findChild(ITracker *this,NameAndLocationRef *nameAndLocation)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  size_t sVar4;
  ITracker *pIVar5;
  long lVar6;
  long lVar7;
  pointer puVar8;
  
  puVar8 = (this->m_children).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_children).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)puVar1 - (long)puVar8;
  if (0 < lVar7 >> 5) {
    lVar6 = (lVar7 >> 5) + 1;
    puVar2 = puVar8 + 2;
    do {
      puVar8 = puVar2;
      sVar4 = (nameAndLocation->location).line;
      if (((puVar8[-2].m_ptr)->m_nameAndLocation).location.line == sVar4) {
        bVar3 = operator==(&(puVar8[-2].m_ptr)->m_nameAndLocation,nameAndLocation);
        if (bVar3) {
          puVar8 = puVar8 + -2;
          goto LAB_0014c19e;
        }
        sVar4 = (nameAndLocation->location).line;
      }
      if (((puVar8[-1].m_ptr)->m_nameAndLocation).location.line == sVar4) {
        bVar3 = operator==(&(puVar8[-1].m_ptr)->m_nameAndLocation,nameAndLocation);
        if (bVar3) {
          puVar8 = puVar8 + -1;
          goto LAB_0014c19e;
        }
        sVar4 = (nameAndLocation->location).line;
      }
      if ((puVar8->m_ptr->m_nameAndLocation).location.line == sVar4) {
        bVar3 = operator==(&puVar8->m_ptr->m_nameAndLocation,nameAndLocation);
        if (bVar3) goto LAB_0014c19e;
        sVar4 = (nameAndLocation->location).line;
      }
      if (((puVar8[1].m_ptr)->m_nameAndLocation).location.line == sVar4) {
        bVar3 = operator==(&(puVar8[1].m_ptr)->m_nameAndLocation,nameAndLocation);
        if (bVar3) {
          puVar8 = puVar8 + 1;
          goto LAB_0014c19e;
        }
      }
      lVar6 = lVar6 + -1;
      lVar7 = lVar7 + -0x20;
      puVar2 = puVar8 + 4;
    } while (1 < lVar6);
    puVar8 = puVar8 + 2;
  }
  lVar7 = lVar7 >> 3;
  if (lVar7 == 1) {
LAB_0014c16c:
    if ((puVar8->m_ptr->m_nameAndLocation).location.line == (nameAndLocation->location).line) {
      bVar3 = operator==(&puVar8->m_ptr->m_nameAndLocation,nameAndLocation);
      if (bVar3) goto LAB_0014c19e;
    }
  }
  else {
    if (lVar7 == 2) {
LAB_0014c14b:
      if ((puVar8->m_ptr->m_nameAndLocation).location.line == (nameAndLocation->location).line) {
        bVar3 = operator==(&puVar8->m_ptr->m_nameAndLocation,nameAndLocation);
        if (bVar3) goto LAB_0014c19e;
      }
      puVar8 = puVar8 + 1;
      goto LAB_0014c16c;
    }
    if (lVar7 == 3) {
      if ((puVar8->m_ptr->m_nameAndLocation).location.line == (nameAndLocation->location).line) {
        bVar3 = operator==(&puVar8->m_ptr->m_nameAndLocation,nameAndLocation);
        if (bVar3) goto LAB_0014c19e;
      }
      puVar8 = puVar8 + 1;
      goto LAB_0014c14b;
    }
  }
  puVar8 = puVar1;
LAB_0014c19e:
  if (puVar8 == (this->m_children).
                super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    pIVar5 = (ITracker *)0x0;
  }
  else {
    pIVar5 = puVar8->m_ptr;
  }
  return pIVar5;
}

Assistant:

ITracker* ITracker::findChild( NameAndLocationRef const& nameAndLocation ) {
        auto it = std::find_if(
            m_children.begin(),
            m_children.end(),
            [&nameAndLocation]( ITrackerPtr const& tracker ) {
                auto const& tnameAndLoc = tracker->nameAndLocation();
                if ( tnameAndLoc.location.line !=
                     nameAndLocation.location.line ) {
                    return false;
                }
                return tnameAndLoc == nameAndLocation;
            } );
        return ( it != m_children.end() ) ? it->get() : nullptr;
    }